

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_cb_dbg.c
# Opt level: O0

void dump(char *timebuf,char *text,FILE *stream,uchar *ptr,size_t size,trace tracetype,
         curl_infotype infotype)

{
  uchar uVar1;
  uint local_4c;
  ulong uStack_48;
  uint width;
  size_t c;
  size_t i;
  trace tracetype_local;
  size_t size_local;
  uchar *ptr_local;
  FILE *stream_local;
  char *text_local;
  char *timebuf_local;
  
  local_4c = 0x10;
  if (tracetype == TRACE_ASCII) {
    local_4c = 0x40;
  }
  curl_mfprintf(stream,"%s%s, %zd bytes (0x%zx)\n",timebuf,text,size,size);
  c = 0;
  do {
    if (size <= c) {
      fflush((FILE *)stream);
      return;
    }
    curl_mfprintf(stream,"%04zx: ",c);
    if (tracetype == TRACE_BIN) {
      for (uStack_48 = 0; uStack_48 < local_4c; uStack_48 = uStack_48 + 1) {
        if (c + uStack_48 < size) {
          curl_mfprintf(stream,"%02x ",ptr[c + uStack_48]);
        }
        else {
          fputs("   ",(FILE *)stream);
        }
      }
    }
    for (uStack_48 = 0; uStack_48 < local_4c && c + uStack_48 < size; uStack_48 = uStack_48 + 1) {
      if ((((tracetype == TRACE_ASCII) && (c + uStack_48 + 1 < size)) &&
          (ptr[c + uStack_48] == '\r')) && (ptr[c + uStack_48 + 1] == '\n')) {
        c = ((uStack_48 + 2) - (ulong)local_4c) + c;
        break;
      }
      if ((ptr[c + uStack_48] < 0x20) || (0x7f < ptr[c + uStack_48])) {
        uVar1 = '.';
      }
      else {
        uVar1 = ptr[c + uStack_48];
      }
      curl_mfprintf(stream,"%c",uVar1);
      if (((tracetype == TRACE_ASCII) && (c + uStack_48 + 2 < size)) &&
         ((ptr[c + uStack_48 + 1] == '\r' && (ptr[c + uStack_48 + 2] == '\n')))) {
        c = ((uStack_48 + 3) - (ulong)local_4c) + c;
        break;
      }
    }
    fputc(10,(FILE *)stream);
    c = local_4c + c;
  } while( true );
}

Assistant:

static void dump(const char *timebuf, const char *text,
                 FILE *stream, const unsigned char *ptr, size_t size,
                 trace tracetype, curl_infotype infotype)
{
  size_t i;
  size_t c;

  unsigned int width = 0x10;

  if(tracetype == TRACE_ASCII)
    /* without the hex output, we can fit more on screen */
    width = 0x40;

  fprintf(stream, "%s%s, %zd bytes (0x%zx)\n", timebuf, text, size, size);

  for(i = 0; i < size; i += width) {

    fprintf(stream, "%04zx: ", i);

    if(tracetype == TRACE_BIN) {
      /* hex not disabled, show it */
      for(c = 0; c < width; c++)
        if(i+c < size)
          fprintf(stream, "%02x ", ptr[i+c]);
        else
          fputs("   ", stream);
    }

    for(c = 0; (c < width) && (i+c < size); c++) {
      /* check for 0D0A; if found, skip past and start a new line of output */
      if((tracetype == TRACE_ASCII) &&
         (i+c+1 < size) && (ptr[i+c] == 0x0D) && (ptr[i+c+1] == 0x0A)) {
        i += (c+2-width);
        break;
      }
#ifdef CURL_DOES_CONVERSIONS
      /* repeat the 0D0A check above but use the host encoding for CRLF */
      if((tracetype == TRACE_ASCII) &&
         (i+c+1 < size) && (ptr[i+c] == '\r') && (ptr[i+c+1] == '\n')) {
        i += (c+2-width);
        break;
      }
      /* convert to host encoding and print this character */
      fprintf(stream, "%c", convert_char(infotype, ptr[i+c]));
#else
      (void)infotype;
      fprintf(stream, "%c", ((ptr[i+c] >= 0x20) && (ptr[i+c] < 0x80)) ?
              ptr[i+c] : UNPRINTABLE_CHAR);
#endif /* CURL_DOES_CONVERSIONS */
      /* check again for 0D0A, to avoid an extra \n if it's at width */
      if((tracetype == TRACE_ASCII) &&
         (i+c+2 < size) && (ptr[i+c+1] == 0x0D) && (ptr[i+c+2] == 0x0A)) {
        i += (c+3-width);
        break;
      }
    }
    fputc('\n', stream); /* newline */
  }
  fflush(stream);
}